

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_b0093a::TGlslangToSpvTraverser::makeGlobalInitializers
          (TGlslangToSpvTraverser *this,TIntermSequence *initializers)

{
  int iVar1;
  TOperator TVar2;
  Block *bp;
  size_type sVar3;
  const_reference ppTVar4;
  undefined4 extraout_var;
  TIntermAggregate *initializer;
  int i;
  TIntermSequence *initializers_local;
  TGlslangToSpvTraverser *this_local;
  TIntermOperator *this_00;
  
  bp = spv::Function::getLastBlock(this->shaderEntry);
  spv::Builder::setBuildPoint(&this->builder,bp);
  initializer._4_4_ = 0;
  while( true ) {
    sVar3 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size
                      (&initializers->
                        super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>);
    if ((int)sVar3 <= initializer._4_4_) break;
    ppTVar4 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                        (&initializers->
                          super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>,
                         (long)initializer._4_4_);
    iVar1 = (*(*ppTVar4)->_vptr_TIntermNode[6])();
    this_00 = (TIntermOperator *)CONCAT44(extraout_var,iVar1);
    if (this_00 != (TIntermOperator *)0x0) {
      TVar2 = glslang::TIntermOperator::getOp(this_00);
      if (TVar2 != EOpFunction) {
        TVar2 = glslang::TIntermOperator::getOp(this_00);
        if (TVar2 != EOpLinkerObjects) {
          (*(this_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[2])(this_00,this);
        }
      }
    }
    initializer._4_4_ = initializer._4_4_ + 1;
  }
  return;
}

Assistant:

void TGlslangToSpvTraverser::makeGlobalInitializers(const glslang::TIntermSequence& initializers)
{
    builder.setBuildPoint(shaderEntry->getLastBlock());
    for (int i = 0; i < (int)initializers.size(); ++i) {
        glslang::TIntermAggregate* initializer = initializers[i]->getAsAggregate();
        if (initializer && initializer->getOp() != glslang::EOpFunction && initializer->getOp() !=
            glslang::EOpLinkerObjects) {

            // We're on a top-level node that's not a function.  Treat as an initializer, whose
            // code goes into the beginning of the entry point.
            initializer->traverse(this);
        }
    }
}